

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase.h
# Opt level: O3

void __thiscall
soplex::
SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::changeRhs(SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *this,int i,
           number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *newRhs,bool scale)

{
  SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar1;
  pointer pnVar2;
  int32_t iVar3;
  int iVar4;
  undefined7 in_register_00000009;
  long lVar5;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar6;
  uint *puVar7;
  pointer pnVar8;
  long in_FS_OFFSET;
  byte bVar9;
  cpp_dec_float<200U,_int,_void> local_118;
  uint local_98 [28];
  int local_28;
  undefined1 local_24;
  undefined8 local_20;
  
  bVar9 = 0;
  if ((int)CONCAT71(in_register_00000009,scale) != 0) {
    ::soplex::infinity::__tls_init();
    local_118.fpclass = cpp_dec_float_finite;
    local_118.prec_elem = 0x1c;
    local_118.data._M_elems[0] = 0;
    local_118.data._M_elems[1] = 0;
    local_118.data._M_elems[2] = 0;
    local_118.data._M_elems[3] = 0;
    local_118.data._M_elems[4] = 0;
    local_118.data._M_elems[5] = 0;
    local_118.data._M_elems[6] = 0;
    local_118.data._M_elems[7] = 0;
    local_118.data._M_elems[8] = 0;
    local_118.data._M_elems[9] = 0;
    local_118.data._M_elems[10] = 0;
    local_118.data._M_elems[0xb] = 0;
    local_118.data._M_elems[0xc] = 0;
    local_118.data._M_elems[0xd] = 0;
    local_118.data._M_elems[0xe] = 0;
    local_118.data._M_elems[0xf] = 0;
    local_118.data._M_elems[0x10] = 0;
    local_118.data._M_elems[0x11] = 0;
    local_118.data._M_elems[0x12] = 0;
    local_118.data._M_elems[0x13] = 0;
    local_118.data._M_elems[0x14] = 0;
    local_118.data._M_elems[0x15] = 0;
    local_118.data._M_elems[0x16] = 0;
    local_118.data._M_elems[0x17] = 0;
    local_118.data._M_elems[0x18] = 0;
    local_118.data._M_elems[0x19] = 0;
    local_118.data._M_elems._104_5_ = 0;
    local_118.data._M_elems[0x1b]._1_3_ = 0;
    local_118.exp = 0;
    local_118.neg = false;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)&local_118,*(double *)(in_FS_OFFSET + -8));
    if ((((newRhs->m_backend).fpclass != cpp_dec_float_NaN) &&
        (local_118.fpclass != cpp_dec_float_NaN)) &&
       (iVar4 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                          (&newRhs->m_backend,&local_118), iVar4 < 0)) {
      pSVar1 = this->lp_scaler;
      pnVar6 = newRhs;
      puVar7 = local_98;
      for (lVar5 = 0x1c; lVar5 != 0; lVar5 = lVar5 + -1) {
        *puVar7 = (pnVar6->m_backend).data._M_elems[0];
        pnVar6 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)((long)pnVar6 + ((ulong)bVar9 * -2 + 1) * 4);
        puVar7 = puVar7 + (ulong)bVar9 * -2 + 1;
      }
      local_28 = (newRhs->m_backend).exp;
      local_24 = (newRhs->m_backend).neg;
      local_20._0_4_ = (newRhs->m_backend).fpclass;
      local_20._4_4_ = (newRhs->m_backend).prec_elem;
      (*pSVar1->_vptr_SPxScaler[0x2e])(&local_118,pSVar1,this,i);
      newRhs = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)&local_118;
    }
  }
  pnVar2 = (this->
           super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).right.val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pnVar6 = newRhs;
  pnVar8 = pnVar2 + i;
  for (lVar5 = 0x1c; lVar5 != 0; lVar5 = lVar5 + -1) {
    (pnVar8->m_backend).data._M_elems[0] = (pnVar6->m_backend).data._M_elems[0];
    pnVar6 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)((long)pnVar6 + ((ulong)bVar9 * -2 + 1) * 4);
    pnVar8 = (pointer)((long)pnVar8 + ((ulong)bVar9 * -2 + 1) * 4);
  }
  pnVar2[i].m_backend.exp = (newRhs->m_backend).exp;
  pnVar2[i].m_backend.neg = (newRhs->m_backend).neg;
  iVar3 = (newRhs->m_backend).prec_elem;
  pnVar2[i].m_backend.fpclass = (newRhs->m_backend).fpclass;
  pnVar2[i].m_backend.prec_elem = iVar3;
  return;
}

Assistant:

virtual void changeRhs(int i, const R& newRhs, bool scale = false)
   {
      if(scale && newRhs < R(infinity))
      {
         assert(_isScaled);
         assert(lp_scaler);
         LPRowSetBase<R>::rhs_w(i) = lp_scaler->scaleRhs(*this, i, newRhs);
      }
      else
         LPRowSetBase<R>::rhs_w(i) = newRhs;

      assert(isConsistent());
   }